

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  void *pvVar1;
  int iVar2;
  int extraout_EAX;
  long lVar3;
  uintptr_t *puVar4;
  uv_tcp_t *puVar5;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  void *pvVar7;
  
  pvVar7 = (void *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_BaseClient).m_state != ConnectingState) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    this->m_expire = lVar3 / 1000000 + 20000;
    (this->super_BaseClient).m_state = ConnectingState;
  }
  puVar4 = (uintptr_t *)operator_new(0x60);
  pvVar1 = (void *)this->m_key;
  *puVar4 = (uintptr_t)pvVar1;
  puVar5 = (uv_tcp_t *)operator_new(0xf8);
  this->m_socket = puVar5;
  puVar5->data = pvVar1;
  uVar6 = uv_default_loop();
  uv_tcp_init(uVar6,this->m_socket);
  uv_tcp_nodelay(this->m_socket,1);
  uv_tcp_keepalive(this->m_socket,1,0x3c);
  iVar2 = uv_tcp_connect(puVar4,this->m_socket,pvVar7,onConnect);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

void xmrig::Client::connect(sockaddr *addr)
{
    setState(ConnectingState);

    uv_connect_t *req = new uv_connect_t;
    req->data = m_storage.ptr(m_key);

    m_socket = new uv_tcp_t;
    m_socket->data = m_storage.ptr(m_key);

    uv_tcp_init(uv_default_loop(), m_socket);
    uv_tcp_nodelay(m_socket, 1);

#   ifndef WIN32
    uv_tcp_keepalive(m_socket, 1, 60);
#   endif

    uv_tcp_connect(req, m_socket, addr, onConnect);

    delete addr;
}